

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O2

int nni_dialer_hold(nni_dialer *d)

{
  int iVar1;
  
  nni_mtx_lock(&dialers_lk);
  if (d->d_closed == false) {
    d->d_ref = d->d_ref + 1;
    iVar1 = 0;
  }
  else {
    iVar1 = 7;
  }
  nni_mtx_unlock(&dialers_lk);
  return iVar1;
}

Assistant:

int
nni_dialer_hold(nni_dialer *d)
{
	int rv;
	nni_mtx_lock(&dialers_lk);
	if (d->d_closed) {
		rv = NNG_ECLOSED;
	} else {
		d->d_ref++;
		rv = 0;
	}
	nni_mtx_unlock(&dialers_lk);
	return (rv);
}